

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall
CoreML::ShapeConstraint::updateSequenceRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  
  ShapeRange::intersect((ShapeRange *)&err,&this->_sequenceRange,other);
  *(size_type *)&(this->_sequenceRange)._maximum = err.field_2._M_allocated_capacity;
  (this->_sequenceRange)._maximum._val = err.field_2._8_8_;
  *(pointer *)&(this->_sequenceRange)._minimum = err._M_dataplus._M_p;
  (this->_sequenceRange)._minimum._val = err._M_string_length;
  return;
}

Assistant:

void ShapeConstraint::updateSequenceRange(const ShapeRange& other) {
    try {
        _sequenceRange = _sequenceRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid sequence range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}